

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

double * ON_BinarySearchDoubleArray(double key,double *base,size_t nel)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  
  if (base == (double *)0x0 || nel == 0) {
    return (double *)0x0;
  }
  dVar3 = key - *base;
  if (0.0 <= dVar3) {
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      dVar3 = key - base[nel - 1];
      if (0.0 < dVar3) goto LAB_004f512a;
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        do {
          uVar2 = nel >> 1;
          if (0.0 <= key - base[uVar2]) {
            if (key - base[uVar2] <= 0.0) {
              base = base + uVar2;
              goto LAB_004f5136;
            }
            base = base + uVar2 + 1;
            uVar2 = nel - (uVar2 + 1);
          }
          bVar1 = true;
          nel = uVar2;
        } while (uVar2 != 0);
        goto LAB_004f5138;
      }
      base = base + (nel - 1);
    }
  }
  else {
LAB_004f512a:
    base = (double *)0x0;
  }
LAB_004f5136:
  bVar1 = false;
LAB_004f5138:
  if (bVar1) {
    return (double *)0x0;
  }
  return base;
}

Assistant:

const double* ON_BinarySearchDoubleArray( double key, const double* base, size_t nel )
{
  if (nel > 0 && base )
  {
    size_t i;
    double d;

    // The end tests are not necessary, but they
    // seem to provide overall speed improvement
    // for the types of searches that call this
    // function.
    d = key-base[0];
    if ( d < 0.0 )
      return 0;
    if ( 0.0 == d )
      return base;

    d = key-base[nel-1];
    if ( d > 0.0 )
      return 0;
    if ( 0.0 == d )
      return (base + (nel-1));

    while ( nel > 0 )
    {
      i = nel/2;
      d = key - base[i];
      if ( d < 0.0 )
      {
        nel = i;
      }
      else if ( d > 0.0 )
      {
        i++;
        base += i;
        nel -= i;
      }
      else
      {
        return base+i;
      }
    }
  }
  return 0;
}